

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O0

auto_ptr<avro::OutputStream> avro::memoryOutputStream(size_t chunkSize)

{
  element_type *__p;
  MemoryOutputStream *in_RDI;
  MemoryOutputStream *this;
  
  this = in_RDI;
  __p = (element_type *)operator_new(0x38);
  MemoryOutputStream::MemoryOutputStream(this,(size_t)in_RDI);
  std::auto_ptr<avro::OutputStream>::auto_ptr((auto_ptr<avro::OutputStream> *)in_RDI,__p);
  return (auto_ptr<avro::OutputStream>)&this->super_OutputStream;
}

Assistant:

std::auto_ptr<OutputStream> memoryOutputStream(size_t chunkSize)
{
    return std::auto_ptr<OutputStream>(new MemoryOutputStream(chunkSize));
}